

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ISceneNode.h
# Opt level: O0

matrix4 * __thiscall irr::scene::ISceneNode::getRelativeTransformation(ISceneNode *this)

{
  bool bVar1;
  long in_RSI;
  vector3d<float> *in_RDI;
  matrix4 smat;
  matrix4 *mat;
  undefined4 in_stack_ffffffffffffff78;
  eConstructor in_stack_ffffffffffffff7c;
  vector3d<float> *this_00;
  vector3d<float> *in_stack_ffffffffffffff98;
  CMatrix4<float> *in_stack_ffffffffffffffa0;
  CMatrix4<float> *in_stack_ffffffffffffffb8;
  CMatrix4<float> *in_stack_ffffffffffffffc0;
  vector3d<float> local_1c [2];
  
  this_00 = in_RDI;
  core::CMatrix4<float>::CMatrix4((CMatrix4<float> *)in_RDI,in_stack_ffffffffffffff7c);
  core::CMatrix4<float>::setRotationDegrees(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  core::CMatrix4<float>::setTranslation
            ((CMatrix4<float> *)in_RDI,(vector3d<float> *)(in_RSI + 0x70));
  core::vector3d<float>::vector3d(local_1c,1.0,1.0,1.0);
  bVar1 = core::vector3d<float>::operator!=
                    (this_00,(vector3d<float> *)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (bVar1) {
    core::CMatrix4<float>::CMatrix4((CMatrix4<float> *)this_00,in_stack_ffffffffffffff7c);
    core::CMatrix4<float>::setScale
              ((CMatrix4<float> *)&stack0xffffffffffffffa4,(vector3d<float> *)(in_RSI + 0x88));
    core::CMatrix4<float>::operator*=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return (matrix4 *)this_00;
}

Assistant:

virtual core::matrix4 getRelativeTransformation() const
	{
		core::matrix4 mat;
		mat.setRotationDegrees(RelativeRotation);
		mat.setTranslation(RelativeTranslation);

		if (RelativeScale != core::vector3df(1.f, 1.f, 1.f)) {
			core::matrix4 smat;
			smat.setScale(RelativeScale);
			mat *= smat;
		}

		return mat;
	}